

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FSDist_COF::SampleState
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FSDist_COF *this)

{
  int iVar1;
  reference pvVar2;
  Index valI;
  ulong uVar3;
  uint uVar4;
  ulong __n;
  double dVar5;
  allocator_type local_21;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,this->_m_nrStateFactors,&local_21);
  uVar4 = 0;
  do {
    __n = (ulong)uVar4;
    if (this->_m_nrStateFactors <= __n) {
      return __return_storage_ptr__;
    }
    iVar1 = rand();
    dVar5 = 0.0;
    for (uVar3 = 0;
        uVar3 < (this->_m_sfacDomainSizes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[__n]; uVar3 = (ulong)((value_type)uVar3 + 1)) {
      dVar5 = dVar5 + *(double *)
                       (*(long *)&(this->_m_probs).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[__n].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data + uVar3 * 8);
      if ((double)iVar1 * 4.656612873077393e-10 <= dVar5) {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (__return_storage_ptr__,__n);
        *pvVar2 = (value_type)uVar3;
        break;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

vector<Index> FSDist_COF::SampleState() const
{
    vector<Index> state(_m_nrStateFactors);

    for(Index i=0; i < _m_nrStateFactors; i++)    
    {  
        double randNr=rand() / (RAND_MAX + 1.0);
        double sum=0;
        for(Index valI = 0; valI < _m_sfacDomainSizes[i]; valI++)
        {
            sum+=_m_probs[i][valI];
            if(randNr<=sum)
            {
                state.at(i)=valI;
                break;
            }
        }
    }
    return state;
}